

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O1

void __thiscall
rudp::session_config::session_config(session_config *this,uint8_t *begin,uint8_t *end)

{
  uint uVar1;
  undefined8 uVar2;
  pointer_____offset_0x10___ *ppuVar3;
  
  if ((long)end - (long)begin == 0x16) {
    if (*begin == '\x10') {
      this->max_out_of_standing_segs = begin[1];
      this->option_flags = begin[2];
      this->maximum_segment_size = *(ushort *)(begin + 4) << 8 | *(ushort *)(begin + 4) >> 8;
      this->retransmission_timeout_value = *(ushort *)(begin + 6) << 8 | *(ushort *)(begin + 6) >> 8
      ;
      this->cumulative_ack_timeout_value = *(ushort *)(begin + 8) << 8 | *(ushort *)(begin + 8) >> 8
      ;
      this->null_segment_timeout_value = *(ushort *)(begin + 10) << 8 | *(ushort *)(begin + 10) >> 8
      ;
      this->transfer_state_timeout_value =
           *(ushort *)(begin + 0xc) << 8 | *(ushort *)(begin + 0xc) >> 8;
      this->max_retrans = begin[0xe];
      this->max_cum_ack = begin[0xf];
      this->max_out_of_seq = begin[0x10];
      this->max_auto_reset = begin[0x11];
      uVar1 = *(uint *)(begin + 0x12);
      this->connection_identifier =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      return;
    }
    uVar2 = __cxa_allocate_exception(1);
    ppuVar3 = &invalid_packet::typeinfo;
  }
  else {
    uVar2 = __cxa_allocate_exception(1);
    ppuVar3 = &unable_to_deserialize_session_config::typeinfo;
  }
  __cxa_throw(uVar2,ppuVar3,0);
}

Assistant:

session_config::session_config( const uint8_t *begin, const uint8_t *end ) {
  if( std::distance( begin, end ) != 22 ) throw unable_to_deserialize_session_config();
  auto iter = begin;
  if( *( iter++ ) != 0x10 ) throw invalid_packet();
  max_out_of_standing_segs = *( iter++ );
  option_flags = *( iter++ );
  ++iter;
  iter = from_be16( iter, maximum_segment_size );
  iter = from_be16( iter, retransmission_timeout_value );
  iter = from_be16( iter, cumulative_ack_timeout_value );
  iter = from_be16( iter, null_segment_timeout_value );
  iter = from_be16( iter, transfer_state_timeout_value );
  max_retrans = *( iter++ );
  max_cum_ack = *( iter++ );
  max_out_of_seq = *( iter++ );
  max_auto_reset = *( iter++ );
  iter = from_be32( iter, connection_identifier );
}